

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastSqrtNR(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int *piVar12;
  long lVar13;
  int Carry;
  uint local_8c;
  Vec_Int_t *local_88;
  ulong local_80;
  int *local_78;
  long local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  ulong local_48;
  int *local_40;
  int *local_38;
  
  local_8c = 1;
  local_40 = pNum;
  if ((nNum & 1U) != 0) {
    __assert_fail("nNum % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x31a,"void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  uVar11 = nNum >> 1;
  if (vRes->nCap < (int)uVar11) {
    if (vRes->pArray == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar11 << 2);
    }
    else {
      piVar7 = (int *)realloc(vRes->pArray,(long)(int)uVar11 << 2);
    }
    vRes->pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_008934eb;
    vRes->nCap = uVar11;
  }
  uVar10 = (ulong)uVar11;
  if (0 < (int)uVar11) {
    memset(vRes->pArray,0,uVar10 * 4);
  }
  vRes->nSize = uVar11;
  uVar2 = nNum * 2;
  local_88 = vRes;
  local_48 = uVar10;
  if (SBORROW4(vTmp->nCap,uVar2) != vTmp->nCap + nNum * -2 < 0) {
    if (vTmp->pArray == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar7 = (int *)realloc(vTmp->pArray,(long)(int)uVar2 << 2);
    }
    vTmp->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
LAB_008934eb:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vTmp->nCap = uVar2;
  }
  if (0 < nNum) {
    memset(vTmp->pArray,0,(ulong)uVar2 << 2);
  }
  vTmp->nSize = uVar2;
  if (0 < (int)uVar11) {
    local_50 = local_88->pArray;
    local_58 = vTmp->pArray;
    local_70 = (long)nNum;
    piVar12 = local_58 + local_70;
    local_68 = local_58 + local_70 + 1;
    piVar7 = local_58 + 1;
    lVar13 = 0;
    uVar10 = 0;
    local_60 = piVar12;
    do {
      piVar5 = local_50;
      piVar4 = local_60;
      uVar11 = local_8c;
      if (*local_60 != 0) {
        __assert_fail("pIn1[0] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                      ,0x323,
                      "void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
      }
      local_80 = uVar10;
      local_78 = piVar7;
      if (1 < uVar10) {
        memset(local_68,0,uVar10 * 4 + 0x3fffffffc & 0x3fffffffc);
      }
      uVar10 = local_80;
      if (local_80 != 0) {
        lVar9 = 0;
        do {
          piVar12[lVar9] = piVar5[lVar9];
          lVar1 = local_80 + lVar9;
          lVar9 = lVar9 + 1;
        } while (lVar1 + 1U < local_80 * 2);
        uVar10 = lVar9 + local_80;
      }
      if ((int)uVar11 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      uVar10 = uVar10 & 0xffffffff;
      piVar4[uVar10] = uVar11 ^ 1;
      piVar4[uVar10 + 1] = 1;
      local_38 = piVar12;
      if (uVar10 != local_80 * 2) {
        __assert_fail("k == 2*i+2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                      ,0x32a,
                      "void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
      }
      lVar9 = local_70 + local_80 * -2;
      local_58[local_80 * 2] = local_40[lVar9 + -1];
      local_58[local_80 * 2 + 1] = local_40[lVar9 + -2];
      lVar9 = 2;
      piVar7 = local_78;
      do {
        iVar6 = Gia_ManHashXor(pNew,uVar11,piVar7[local_70]);
        Wlc_BlastFullAdder(pNew,iVar6,*piVar7,local_8c,(int *)&local_8c,piVar7);
        lVar1 = lVar9 + lVar13;
        lVar9 = lVar9 + -1;
        piVar7 = piVar7 + -1;
      } while (lVar1 != 1 && -1 < lVar1 + -1);
      local_50[local_80] = local_8c;
      uVar10 = local_80 + 1;
      piVar12 = local_38 + 1;
      lVar13 = lVar13 + 2;
      piVar7 = local_78 + 2;
    } while (uVar10 != local_48);
  }
  iVar6 = local_88->nSize;
  if (1 < iVar6) {
    piVar7 = local_88->pArray;
    iVar8 = -1;
    lVar13 = 0;
    do {
      iVar3 = piVar7[lVar13];
      piVar7[lVar13] = piVar7[iVar6 + iVar8];
      piVar7[local_88->nSize + iVar8] = iVar3;
      lVar13 = lVar13 + 1;
      iVar6 = local_88->nSize;
      iVar8 = iVar8 + -1;
    } while (lVar13 < iVar6 / 2);
  }
  return;
}

Assistant:

void Wlc_BlastSqrtNR( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int * pSqr, * pRem, * pIn1;
    int i, k, Carry = 1;
    assert( nNum % 2 == 0 );
    Vec_IntFill( vRes, nNum/2, 0 );
    Vec_IntFill( vTmp, 2*nNum, 0 );
    pSqr = Vec_IntArray( vRes );
    pRem = Vec_IntArray( vTmp );
    pIn1 = pRem + nNum;
    for ( i = 0; i < nNum/2; i++ )
    {
        int SqrPrev = Carry;
        assert( pIn1[0] == 0 );
        for ( k = 1; k < i; k++ )
            pIn1[k] = 0;
        for ( k = i; k < 2*i; k++ )
            pIn1[k] = pSqr[k-i];
        pIn1[k++] = Abc_LitNot(Carry);
        pIn1[k++] = 1;
        assert( k == 2*i+2 );
        pRem[2*i+0] = pNum[nNum-2*i-1];
        pRem[2*i+1] = pNum[nNum-2*i-2];
        for ( k = 2*i+1; k >= 0; k-- )
            Wlc_BlastFullAdder( pNew, Gia_ManHashXor(pNew, SqrPrev, pIn1[k]), pRem[k], Carry, &Carry, &pRem[k] );
        pSqr[i] = Carry;
    }
    Vec_IntReverseOrder( vRes );
}